

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O0

void __thiscall
tchecker::local_var_statement_t::local_var_statement_t
          (local_var_statement_t *this,shared_ptr<const_tchecker::var_expression_t> *variable,
          shared_ptr<const_tchecker::expression_t> *init)

{
  element_type *peVar1;
  invalid_argument *piVar2;
  element_type *peVar3;
  shared_ptr<const_tchecker::expression_t> *init_local;
  shared_ptr<const_tchecker::var_expression_t> *variable_local;
  local_var_statement_t *this_local;
  
  statement_t::statement_t((statement_t *)this);
  *(undefined ***)this = &PTR__local_var_statement_t_004892c8;
  *(undefined ***)this = &PTR__local_var_statement_t_004892c8;
  std::shared_ptr<const_tchecker::var_expression_t>::shared_ptr(&this->_variable,variable);
  std::shared_ptr<const_tchecker::expression_t>::shared_ptr(&this->_initial_value,init);
  peVar1 = std::__shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_variable).
                       super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                     );
  if (peVar1 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr local variable");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_initial_value).
                       super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar3 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr initial value");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

local_var_statement_t::local_var_statement_t(std::shared_ptr<tchecker::var_expression_t const> const & variable,
                                             std::shared_ptr<tchecker::expression_t const> const & init)
    : _variable(variable), _initial_value(init)
{
  if (_variable.get() == nullptr)
    throw std::invalid_argument("nullptr local variable");
  if (_initial_value.get() == nullptr)
    throw std::invalid_argument("nullptr initial value");
}